

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusmenuadaptor_p.cpp
# Opt level: O1

void __thiscall
QDBusMenuAdaptor::qt_static_metacall(QDBusMenuAdaptor *this,QObject *_o,Call _c,int _id,void **_a)

{
  uint id;
  long *plVar1;
  code *pcVar2;
  long lVar3;
  QArrayData *pQVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  uint uVar7;
  undefined8 *puVar8;
  undefined4 in_register_0000000c;
  long *plVar9;
  InterfaceType *pIVar10;
  int iVar11;
  anon_union_24_3_e3d07ef4_for_data *paVar12;
  anon_union_24_3_e3d07ef4_for_data *paVar13;
  QMetaObject *pQVar14;
  anon_union_24_3_e3d07ef4_for_data *paVar15;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_20;
  
  plVar9 = (long *)CONCAT44(in_register_0000000c,_id);
  paVar15 = &local_48;
  paVar12 = &local_48;
  paVar13 = &local_48;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar11 = (int)_o;
  switch((ulong)_o & 0xffffffff);
  switch(_c) {
  case InvokeMetaMethod:
    _o = (QObject *)(ulong)*(uint *)plVar9[1];
    ItemActivationRequested(this,*(uint *)plVar9[1],*(uint *)plVar9[2]);
    break;
  case ReadProperty:
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = plVar9[1];
    local_48._16_8_ = plVar9[2];
    pQVar14 = &staticMetaObject;
    QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_48.shared);
    _o = (QObject *)pQVar14;
    break;
  case WriteProperty:
    _o = (QObject *)(ulong)*(uint *)plVar9[1];
    LayoutUpdated(this,*(uint *)plVar9[1],*(int *)plVar9[2]);
    break;
  case ResetProperty:
    _o = (QObject *)(ulong)*(uint *)plVar9[1];
    AboutToShow(this,*(uint *)plVar9[1]);
    if ((undefined1 *)*plVar9 != (undefined1 *)0x0) {
      *(undefined1 *)*plVar9 = 0;
    }
    break;
  case CreateInstance:
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    AboutToShowGroup((QList<int> *)&local_48,this,(QList<int> *)plVar9[1],(QList<int> *)plVar9[2]);
    goto LAB_0063fdd2;
  case IndexOfMethod:
    id = *(uint *)&(((QDBusVariant *)plVar9[1])->m_variant).d.data;
    _o = (QObject *)(ulong)id;
    Event(this,id,(QString *)plVar9[2],(QDBusVariant *)plVar9[1],(uint)_a);
    break;
  case RegisterPropertyMetaType:
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    EventGroup((QList<int> *)&local_48,this,(QDBusMenuEventList *)plVar9[1]);
LAB_0063fdd2:
    _o = (QObject *)this;
    if ((QArrayDataPointer<int> *)*plVar9 != (QArrayDataPointer<int> *)0x0) {
      QArrayDataPointer<int>::operator=
                ((QArrayDataPointer<int> *)*plVar9,(QArrayDataPointer<int> *)&local_48);
      _o = (QObject *)paVar15;
    }
    if ((QArrayData *)local_48.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_48.shared = *(int *)local_48.shared + -1;
      UNLOCK();
      if (*(int *)local_48.shared == 0) {
        _o = (QObject *)0x4;
        QArrayData::deallocate((QArrayData *)local_48.shared,4,0x10);
      }
    }
    break;
  case RegisterMethodArgumentMetaType:
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    GetGroupProperties((QDBusMenuItemList *)&local_48,(QDBusMenuAdaptor *)_o,(QList<int> *)plVar9[1]
                       ,(QStringList *)plVar9[2]);
    if ((QArrayDataPointer<QDBusMenuItem> *)*plVar9 != (QArrayDataPointer<QDBusMenuItem> *)0x0) {
      QArrayDataPointer<QDBusMenuItem>::operator=
                ((QArrayDataPointer<QDBusMenuItem> *)*plVar9,
                 (QArrayDataPointer<QDBusMenuItem> *)&local_48);
      _o = (QObject *)paVar13;
    }
    QArrayDataPointer<QDBusMenuItem>::~QArrayDataPointer
              ((QArrayDataPointer<QDBusMenuItem> *)&local_48);
    break;
  case BindableProperty:
    _o = (QObject *)(ulong)*(uint *)plVar9[1];
    uVar7 = GetLayout(this,*(uint *)plVar9[1],*(int *)plVar9[2],(QStringList *)plVar9[3],
                      (QDBusMenuLayoutItem *)plVar9[4]);
    if ((uint *)*plVar9 != (uint *)0x0) {
      *(uint *)*plVar9 = uVar7;
    }
    break;
  case CustomCall:
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    GetProperty((QDBusVariant *)&local_48,(QDBusMenuAdaptor *)_o,*(int *)plVar9[1],
                (QString *)plVar9[2]);
    if ((QVariant *)*plVar9 != (QVariant *)0x0) {
      ::QVariant::operator=((QVariant *)*plVar9,(QVariant *)&local_48);
      _o = (QObject *)paVar12;
    }
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  if (iVar11 != 1) {
    if (iVar11 != 5) {
      if (iVar11 != 7) goto switchD_0063fc28_caseD_2;
      switch(_c) {
      case ReadProperty:
        puVar8 = (undefined8 *)*plVar9;
        if (*(int *)plVar9[1] == 0) {
          pIVar10 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QDBusMenuItem>_>::metaType;
        }
        else {
          if (*(int *)plVar9[1] != 1) goto LAB_0063feb5;
          pIVar10 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QDBusMenuItemKeys>_>::metaType;
        }
        break;
      default:
        puVar8 = (undefined8 *)*plVar9;
LAB_0063feb5:
        *puVar8 = 0;
        goto LAB_0063fed1;
      case CreateInstance:
      case RegisterMethodArgumentMetaType:
        puVar8 = (undefined8 *)*plVar9;
        if (*(int *)plVar9[1] != 0) goto LAB_0063feb5;
        pIVar10 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<int>_>::metaType;
        break;
      case IndexOfMethod:
        puVar8 = (undefined8 *)*plVar9;
        if (*(int *)plVar9[1] != 2) goto LAB_0063feb5;
        pIVar10 = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusVariant>::metaType;
        break;
      case RegisterPropertyMetaType:
        puVar8 = (undefined8 *)*plVar9;
        if (*(int *)plVar9[1] != 0) goto LAB_0063feb5;
        pIVar10 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QDBusMenuEvent>_>::metaType;
      }
      *puVar8 = pIVar10;
LAB_0063fed1:
      if (iVar11 == 1) goto switchD_0063fc28_caseD_1;
      if (iVar11 != 5) goto switchD_0063fc28_caseD_2;
    }
    plVar1 = (long *)plVar9[1];
    if (((code *)*plVar1 == ItemActivationRequested) && (plVar1[1] == 0)) {
      *(undefined4 *)*plVar9 = 0;
      goto switchD_0063fc28_caseD_2;
    }
    if (((code *)*plVar1 == ItemsPropertiesUpdated) && (plVar1[1] == 0)) {
      *(undefined4 *)*plVar9 = 1;
      goto switchD_0063fc28_caseD_2;
    }
    pcVar2 = (code *)*plVar1;
    lVar3 = plVar1[1];
    if (pcVar2 == LayoutUpdated && lVar3 == 0) {
      *(undefined4 *)*plVar9 = 2;
    }
    if (pcVar2 == LayoutUpdated && lVar3 == 0 || iVar11 != 1) goto switchD_0063fc28_caseD_2;
  }
switchD_0063fc28_caseD_1:
  puVar8 = (undefined8 *)*plVar9;
  if (_c == WriteProperty) {
    *(undefined4 *)puVar8 = 4;
  }
  else {
    if (_c == ReadProperty) {
      textDirection((QString *)&local_48,(QDBusMenuAdaptor *)_o);
    }
    else {
      if (_c != InvokeMetaMethod) goto switchD_0063fc28_caseD_2;
      status((QString *)&local_48,(QDBusMenuAdaptor *)_o);
    }
    pQVar4 = (QArrayData *)*puVar8;
    puVar5 = (undefined1 *)puVar8[1];
    *puVar8 = local_48.shared;
    puVar8[1] = local_48._8_8_;
    puVar6 = (undefined1 *)puVar8[2];
    puVar8[2] = local_48._16_8_;
    local_48.shared = (PrivateShared *)pQVar4;
    local_48._8_8_ = puVar5;
    local_48._16_8_ = puVar6;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
switchD_0063fc28_caseD_2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusMenuAdaptor::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDBusMenuAdaptor *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->ItemActivationRequested((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[2]))); break;
        case 1: _t->ItemsPropertiesUpdated((*reinterpret_cast< std::add_pointer_t<QDBusMenuItemList>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDBusMenuItemKeysList>>(_a[2]))); break;
        case 2: _t->LayoutUpdated((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: { bool _r = _t->AboutToShow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 4: { QList<int> _r = _t->AboutToShowGroup((*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QList<int>&>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QList<int>*>(_a[0]) = std::move(_r); }  break;
        case 5: _t->Event((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QDBusVariant>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[4]))); break;
        case 6: { QList<int> _r = _t->EventGroup((*reinterpret_cast< std::add_pointer_t<QDBusMenuEventList>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QList<int>*>(_a[0]) = std::move(_r); }  break;
        case 7: { QDBusMenuItemList _r = _t->GetGroupProperties((*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QDBusMenuItemList*>(_a[0]) = std::move(_r); }  break;
        case 8: { uint _r = _t->GetLayout((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QDBusMenuLayoutItem&>>(_a[4])));
            if (_a[0]) *reinterpret_cast< uint*>(_a[0]) = std::move(_r); }  break;
        case 9: { QDBusVariant _r = _t->GetProperty((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QDBusVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuItemKeysList >(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuItemList >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 2:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusVariant >(); break;
            }
            break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuEventList >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDBusMenuAdaptor::*)(int , uint )>(_a, &QDBusMenuAdaptor::ItemActivationRequested, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDBusMenuAdaptor::*)(const QDBusMenuItemList & , const QDBusMenuItemKeysList & )>(_a, &QDBusMenuAdaptor::ItemsPropertiesUpdated, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDBusMenuAdaptor::*)(uint , int )>(_a, &QDBusMenuAdaptor::LayoutUpdated, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->status(); break;
        case 1: *reinterpret_cast<QString*>(_v) = _t->textDirection(); break;
        case 2: *reinterpret_cast<uint*>(_v) = _t->version(); break;
        default: break;
        }
    }
}